

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

char * Curl_checkheaders(SessionHandle *data,char *thisheader)

{
  curl_slist *pcVar1;
  int iVar2;
  size_t max;
  
  max = strlen(thisheader);
  pcVar1 = (data->set).headers;
  while( true ) {
    if (pcVar1 == (curl_slist *)0x0) {
      return (char *)0x0;
    }
    iVar2 = Curl_raw_nequal(pcVar1->data,thisheader,max);
    if (iVar2 != 0) break;
    pcVar1 = pcVar1->next;
  }
  return pcVar1->data;
}

Assistant:

char *Curl_checkheaders(struct SessionHandle *data, const char *thisheader)
{
  struct curl_slist *head;
  size_t thislen = strlen(thisheader);

  for(head = data->set.headers; head; head=head->next) {
    if(Curl_raw_nequal(head->data, thisheader, thislen))
      return head->data;
  }
  return NULL;
}